

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamZ.cpp
# Opt level: O3

void __thiscall OpenMD::TetrahedralityParamZ::writeQz(TetrahedralityParamZ *this)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  char cVar4;
  double *pdVar5;
  ostream *poVar6;
  pointer pdVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  ofstream qZstream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  pdVar3 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar13 = 0.0;
  pdVar2 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar5 = pdVar2; pdVar5 != pdVar3; pdVar5 = pdVar5 + 1) {
    dVar13 = dVar13 + *pdVar5;
  }
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    snprintf(painCave.errMsg,2000,"TetrahedralityParamZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#Tetrahedrality Parameters (",0x1c);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#nFrames:\t",10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection 1: (",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript1_)._M_dataplus._M_p,
                        (this->selectionScript1_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection 2: (",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript2_)._M_dataplus._M_p,
                        (this->selectionScript2_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tQk\n",4);
    pdVar7 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar7;
    if (lVar8 != 0) {
      lVar11 = (long)pdVar3 - (long)pdVar2;
      lVar12 = lVar11 >> 3;
      auVar15._8_4_ = (int)(lVar11 >> 0x23);
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = 0x45300000;
      uVar9 = lVar8 >> 3;
      uVar10 = 0;
      do {
        auVar19._8_4_ = (int)(uVar9 >> 0x20);
        auVar19._0_8_ = uVar9;
        auVar19._12_4_ = 0x45300000;
        iVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        if (iVar1 != 0) {
          dVar16 = (double)iVar1;
          dVar17 = pdVar7[uVar10] / dVar16;
          dVar16 = (this->sliceQ2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10] / dVar16 - dVar17 * dVar17;
          if (dVar16 < 0.0) {
            dVar16 = sqrt(dVar16);
          }
          else {
            dVar16 = SQRT(dVar16);
          }
          dVar18 = (((double)uVar10 + 0.5) *
                   (dVar13 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)))) /
                   ((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
          iVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10];
          if (iVar1 == 1) {
            poVar6 = std::ostream::_M_insert<double>(dVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
            poVar6 = std::ostream::_M_insert<double>(dVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          }
          else {
            dVar14 = (double)(iVar1 + -1);
            if (dVar14 < 0.0) {
              dVar14 = sqrt(dVar14);
            }
            else {
              dVar14 = SQRT(dVar14);
            }
            poVar6 = std::ostream::_M_insert<double>(dVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
            poVar6 = std::ostream::_M_insert<double>(dVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
            poVar6 = std::ostream::_M_insert<double>((dVar16 * 1.96) / dVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          }
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        pdVar7 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
      } while (uVar10 < uVar9);
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void TetrahedralityParamZ::writeQz() {
    // compute average box length:

    RealType zSum = 0.0;
    for (std::vector<RealType>::iterator j = zBox_.begin(); j != zBox_.end();
         ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    std::ofstream qZstream(outputFilename_.c_str());
    if (qZstream.is_open()) {
      qZstream << "#Tetrahedrality Parameters (" << axisLabel_ << ")\n";

      qZstream << "#nFrames:\t" << zBox_.size() << "\n";
      qZstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qZstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qZstream << "#" << axisLabel_ << "\tQk\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / sliceQ_.size();
        if (sliceCount_[i] != 0) {
          RealType mean   = sliceQ_[i] / sliceCount_[i];
          RealType stdDev = sqrt(sliceQ2_[i] / sliceCount_[i] - mean * mean);
          if (sliceCount_[i] == 1) {
            qZstream << z << "\t" << mean << "\n";
          } else {
            RealType e95 = 1.96 * stdDev / sqrt(sliceCount_[i] - 1);
            qZstream << z << "\t" << mean << "\t" << e95 << "\n";
          }
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TetrahedralityParamZ: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qZstream.close();
  }